

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Deserializer::BreakdownFieldType
          (BP5Deserializer *this,char *FieldType,bool *Operator,bool *MinMax)

{
  char cVar1;
  runtime_error *this_00;
  
  if (*FieldType == 'M') {
    cVar1 = FieldType[9];
    if (cVar1 == 'O') {
      *Operator = true;
      cVar1 = FieldType[0xb];
    }
    if (cVar1 == 'M') {
      *MinMax = true;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"BP5 unable to parse metadata, likely old version");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BP5Deserializer::BreakdownFieldType(const char *FieldType, bool &Operator, bool &MinMax)
{
    if (FieldType[0] != 'M')
    {
        throw std::runtime_error("BP5 unable to parse metadata, likely old version");
    }

    // should start with "MetaArray"
    FieldType += strlen("MetaArray");
    if (FieldType == 0)
        return;
    if (FieldType[0] == 'O')
    {
        Operator = true;
        FieldType += strlen("Op");
    }
    if (FieldType[0] == 'M')
    {
        MinMax = true;
    }
}